

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwinsizes.cpp
# Opt level: O0

void testwin4(void)

{
  char *local_b8;
  undefined4 local_b0;
  undefined4 local_a8;
  Am_Style *local_a0;
  undefined4 local_98;
  undefined4 local_90;
  undefined4 local_88;
  undefined4 local_80;
  undefined4 local_78;
  undefined4 local_70;
  undefined4 local_68;
  undefined4 local_60;
  undefined4 local_58;
  undefined8 local_50;
  Am_Style *local_40;
  Am_Drawonable *local_38;
  undefined1 *local_30;
  Am_Drawonable *local_28;
  Am_Style local_10 [8];
  
  local_38 = root;
  local_40 = local_10;
  Am_Style::Am_Style(local_40,(Am_Style *)&blue);
  local_a0 = local_40;
  local_b8 = "D4 Icon";
  local_50 = 0;
  local_58 = 1;
  local_60 = 0;
  local_68 = 0;
  local_70 = 1;
  local_78 = 300;
  local_80 = 300;
  local_88 = 100;
  local_90 = 100;
  local_98 = 0;
  local_a8 = 0;
  local_b0 = 1;
  local_30 = (undefined1 *)&local_b8;
  d4 = (Am_Drawonable *)(*(code *)**(undefined8 **)local_38)(local_38,900,0xa0,200,200,"D4");
  local_28 = d4;
  Am_Style::~Am_Style(local_10);
  (**(code **)(*(long *)d4 + 0xa0))();
  print_win_info(d4,"D4");
  change_pos_dim(d4);
  return;
}

Assistant:

void
testwin4()
{
  //printf("Hit RETURN to bring up blue window:");
  //getchar();

  d4 = root->Create(TESTWINSIZES_D4_LEFT, 160, 200, 200, "D4", "D4 Icon", true,
                    false, blue, false,
                    // Min width and height
                    100, 100,
                    // Max width and height
                    300, 300);
  d4->Flush_Output();

  print_win_info(d4, "D4");

  //  change_min_max(d4);
  change_pos_dim(d4);
}